

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_narrow_sat_s8_arm(CPUARMState *env,uint64_t x)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  bVar2 = (byte)x;
  if ((int)(short)x != (int)(char)bVar2) {
    bVar2 = 0x80 - (-1 < (int)x << 0x10);
    (env->vfp).qc[0] = 1;
  }
  uVar3 = (uint)(x >> 0x10);
  if ((int)(short)(x >> 0x10) != (int)(char)(x >> 0x10)) {
    uVar3 = (uint)(byte)(0x80 - (-1 < (int)(uVar3 << 0x10)));
    (env->vfp).qc[0] = 1;
  }
  uVar4 = (uint)(x >> 0x20);
  if ((int)(short)(x >> 0x20) != (int)(char)(x >> 0x20)) {
    uVar4 = (uint)(byte)(0x80 - (-1 < (int)(uVar4 << 0x10)));
    (env->vfp).qc[0] = 1;
  }
  uVar1 = (ushort)(x >> 0x30);
  uVar5 = (uint)uVar1;
  if ((int)(short)uVar1 != (int)(char)(x >> 0x30)) {
    uVar5 = (uint)(byte)(0x80 - (-1 < (int)((uint)uVar1 << 0x10)));
    (env->vfp).qc[0] = 1;
  }
  return uVar5 << 0x18 | (uVar4 & 0xff) << 0x10 | (uint)bVar2 | (uVar3 & 0xff) << 8;
}

Assistant:

uint32_t HELPER(neon_narrow_sat_s8)(CPUARMState *env, uint64_t x)
{
    int16_t s;
    uint8_t d;
    uint32_t res = 0;
#define SAT8(n) \
    s = x >> n; \
    if (s != (int8_t)s) { \
        d = (s >> 15) ^ 0x7f; \
        SET_QC(); \
    } else  { \
        d = s; \
    } \
    res |= (uint32_t)d << (n / 2);

    SAT8(0);
    SAT8(16);
    SAT8(32);
    SAT8(48);
#undef SAT8
    return res;
}